

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

int output_nbits(Buffer *buffer,int bits,int n)

{
  Buffer_t *pBVar1;
  uint uVar2;
  int local_20;
  uint local_1c;
  int lbits_to_go;
  int lbitbuffer;
  int n_local;
  int bits_local;
  Buffer *buffer_local;
  
  local_1c = buffer->bitbuffer;
  local_20 = buffer->bits_to_go;
  lbits_to_go = n;
  if (0x20 < local_20 + n) {
    local_1c = bits >> ((char)n - (byte)local_20 & 0x1f) & output_nbits::mask[local_20] |
               local_1c << ((byte)local_20 & 0x1f);
    pBVar1 = buffer->current;
    buffer->current = pBVar1 + 1;
    *pBVar1 = (Buffer_t)local_1c;
    lbits_to_go = n - local_20;
    local_20 = 8;
  }
  uVar2 = bits & output_nbits::mask[lbits_to_go] | local_1c << ((byte)lbits_to_go & 0x1f);
  for (local_20 = local_20 - lbits_to_go; local_20 < 1; local_20 = local_20 + 8) {
    pBVar1 = buffer->current;
    buffer->current = pBVar1 + 1;
    *pBVar1 = (Buffer_t)((int)uVar2 >> (-(char)local_20 & 0x1fU));
  }
  buffer->bitbuffer = uVar2;
  buffer->bits_to_go = local_20;
  return 0;
}

Assistant:

static void
output_nbits(char *outfile, int bits, int n)
{
    /* AND mask for the right-most n bits */
    static int mask[9] = {0, 1, 3, 7, 15, 31, 63, 127, 255};
	/*
	 * insert bits at end of buffer
	 */
	buffer2 <<= n;
/*	buffer2 |= ( bits & ((1<<n)-1) ); */
	buffer2 |= ( bits & (*(mask+n)) );
	bits_to_go2 -= n;
	if (bits_to_go2 <= 0) {
		/*
		 * buffer2 full, put out top 8 bits
		 */

	        outfile[noutchar] = ((buffer2>>(-bits_to_go2)) & 0xff);

		if (noutchar < noutmax) noutchar++;
		
		bits_to_go2 += 8;
	}
	bitcount += n;
}